

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox_safe.cpp
# Opt level: O2

void __thiscall zmq::mailbox_safe_t::mailbox_safe_t(mailbox_safe_t *this,mutex_t *sync_)

{
  bool bVar1;
  
  (this->super_i_mailbox)._vptr_i_mailbox = (_func_int **)&PTR__mailbox_safe_t_001d1030;
  ypipe_t<zmq::command_t,_16>::ypipe_t(&this->_cpipe);
  std::_V2::condition_variable_any::condition_variable_any(&(this->_cond_var)._cv);
  this->_sync = sync_;
  (this->_signalers).super__Vector_base<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_signalers).super__Vector_base<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_signalers).super__Vector_base<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = ypipe_t<zmq::command_t,_16>::check_read(&this->_cpipe);
  if (bVar1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!ok",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mailbox_safe.cpp"
            ,0x2b);
    fflush(_stderr);
    zmq_abort("!ok");
  }
  return;
}

Assistant:

zmq::mailbox_safe_t::mailbox_safe_t (mutex_t *sync_) : _sync (sync_)
{
    //  Get the pipe into passive state. That way, if the users starts by
    //  polling on the associated file descriptor it will get woken up when
    //  new command is posted.
    const bool ok = _cpipe.check_read ();
    zmq_assert (!ok);
}